

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::Dump
          (CordRepBtree *this,CordRep *rep,string_view label,bool include_contents,ostream *stream)

{
  ostream *stream_00;
  ostream *poVar1;
  undefined7 in_register_00000081;
  char local_29;
  
  stream_00 = (ostream *)CONCAT71(in_register_00000081,include_contents);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT71(in_register_00000081,include_contents),
             "===================================\n",0x24);
  if (rep != (CordRep *)0x0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream_00,(char *)label._M_len,(long)rep);
    local_29 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_29,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream_00,"-----------------------------------\n",0x24);
  }
  if (this == (CordRepBtree *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(stream_00,"NULL\n",5);
  }
  else {
    anon_unknown_0::DumpAll(&this->super_CordRep,label._M_str._0_1_,stream_00,0);
  }
  return;
}

Assistant:

void CordRepBtree::Dump(const CordRep* rep, absl::string_view label,
                        bool include_contents, std::ostream& stream) {
  stream << "===================================\n";
  if (!label.empty()) {
    stream << label << '\n';
    stream << "-----------------------------------\n";
  }
  if (rep) {
    DumpAll(rep, include_contents, stream);
  } else {
    stream << "NULL\n";
  }
}